

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_quic_transport_params_parse_clienthello_impl
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents,bool used_legacy_codepoint)

{
  SSL *ssl;
  uint8_t *__src;
  size_t new_size;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  Array<unsigned_char> *this;
  ptrdiff_t _Num;
  
  ssl = hs->ssl;
  iVar3 = SSL_is_quic(ssl);
  if (contents == (CBS *)0x0) {
    if (iVar3 == 0) {
      if ((hs->config->quic_transport_params).size_ != 0) {
        ERR_put_error(0x10,0,0x131,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xb17);
        *out_alert = 'P';
        return false;
      }
      return true;
    }
    if (((hs->config->field_0x10e & 2) == 0) == used_legacy_codepoint) {
      return true;
    }
    *out_alert = 'm';
  }
  else {
    if (iVar3 != 0) {
      uVar2 = ssl_protocol_version(ssl);
      if (uVar2 != 0x304) {
        __assert_fail("ssl_protocol_version(ssl) == TLS1_3_VERSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xb2d,
                      "bool bssl::ext_quic_transport_params_parse_clienthello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                     );
      }
      if (((hs->config->field_0x10e & 2) == 0) == used_legacy_codepoint) {
        return true;
      }
      this = &ssl->s3->peer_quic_transport_params;
      __src = contents->data;
      new_size = contents->len;
      bVar1 = Array<unsigned_char>::InitUninitialized(this,new_size);
      if (new_size == 0 || !bVar1) {
        return bVar1;
      }
      memmove(this->data_,__src,new_size);
      return bVar1;
    }
    if (used_legacy_codepoint) {
      return true;
    }
    *out_alert = 'n';
  }
  return false;
}

Assistant:

static bool ext_quic_transport_params_parse_clienthello_impl(
    SSL_HANDSHAKE *hs, uint8_t *out_alert, CBS *contents,
    bool used_legacy_codepoint) {
  SSL *const ssl = hs->ssl;
  if (!contents) {
    if (!SSL_is_quic(ssl)) {
      if (hs->config->quic_transport_params.empty()) {
        return true;
      }
      // QUIC transport parameters must not be set if |ssl| is not configured
      // for QUIC.
      OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_TRANSPORT_PARAMETERS_MISCONFIGURED);
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
    if (used_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
      // Silently ignore because we expect the other QUIC codepoint.
      return true;
    }
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }
  if (!SSL_is_quic(ssl)) {
    if (used_legacy_codepoint) {
      // Ignore the legacy private-use codepoint because that could be sent
      // to mean something else than QUIC transport parameters.
      return true;
    }
    // Fail if we received the codepoint registered with IANA for QUIC
    // because that is not allowed outside of QUIC.
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    return false;
  }
  assert(ssl_protocol_version(ssl) == TLS1_3_VERSION);
  if (used_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
    // Silently ignore because we expect the other QUIC codepoint.
    return true;
  }
  return ssl->s3->peer_quic_transport_params.CopyFrom(*contents);
}